

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O0

int run_test_tcp_open_connected(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_128 [8];
  uv_buf_t buf;
  undefined1 local_110 [4];
  uv_os_sock_t sock;
  uv_tcp_t client;
  sockaddr_in addr;
  
  _local_128 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&client.queued_fds);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x154,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  startup();
  buf.len._4_4_ = create_tcp_socket();
  iVar1 = connect(buf.len._4_4_,(sockaddr *)&client.queued_fds,0x10);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x159,"0 == connect(sock, (struct sockaddr*) &addr, sizeof(addr))");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)local_110);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x15b,"0 == uv_tcp_init(uv_default_loop(), &client)");
    abort();
  }
  iVar1 = uv_tcp_open((uv_tcp_t *)local_110,buf.len._4_4_);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x15d,"0 == uv_tcp_open(&client, sock)");
    abort();
  }
  iVar1 = uv_write(&write_req,(uv_stream_t *)local_110,(uv_buf_t *)local_128,1,write_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x15f,"0 == uv_write(&write_req, (uv_stream_t*) &client, &buf, 1, write_cb)");
    abort();
  }
  iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)local_110,shutdown_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x161,"0 == uv_shutdown(&shutdown_req, (uv_stream_t*) &client, shutdown_cb)");
    abort();
  }
  iVar1 = uv_read_start((uv_stream_t *)local_110,alloc_cb,read_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x163,"0 == uv_read_start((uv_stream_t*) &client, alloc_cb, read_cb)");
    abort();
  }
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (shutdown_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x167,"shutdown_cb_called == 1");
    abort();
  }
  if (write_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x168,"write_cb_called == 1");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x169,"close_cb_called == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x16b,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_open_connected) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_sock_t sock;
  uv_buf_t buf = uv_buf_init("PING", 4);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  ASSERT(0 == connect(sock, (struct sockaddr*) &addr,  sizeof(addr)));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &client));

  ASSERT(0 == uv_tcp_open(&client, sock));

  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &client, &buf, 1, write_cb));

  ASSERT(0 == uv_shutdown(&shutdown_req, (uv_stream_t*) &client, shutdown_cb));

  ASSERT(0 == uv_read_start((uv_stream_t*) &client, alloc_cb, read_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(shutdown_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}